

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,Select *pSelect,
                      int isTemp,int noErr)

{
  sqlite3 *db;
  Table *pTable;
  Db *pDVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  Select *pSVar7;
  char *pcVar8;
  Schema **ppSVar9;
  Token *pName;
  DbFixer sFix;
  Token *local_80;
  Token local_78;
  DbFixer local_60;
  
  local_80 = (Token *)0x0;
  db = pParse->db;
  if (pParse->nVar < 1) {
    sqlite3StartTable(pParse,pName1,pName2,isTemp,1,0,noErr);
    pTable = pParse->pNewTable;
    if ((pTable != (Table *)0x0) && (pParse->nErr == 0)) {
      sqlite3TwoPartName(pParse,pName1,pName2,&local_80);
      if (pTable->pSchema == (Schema *)0x0) {
        uVar6 = 0xfff0bdc0;
      }
      else {
        uVar4 = db->nDb;
        if ((int)uVar4 < 1) {
          uVar6 = 0;
        }
        else {
          ppSVar9 = &db->aDb->pSchema;
          uVar5 = 0;
          do {
            uVar6 = uVar5;
            if (*ppSVar9 == pTable->pSchema) break;
            uVar5 = uVar5 + 1;
            ppSVar9 = ppSVar9 + 4;
            uVar6 = (ulong)uVar4;
          } while (uVar4 != uVar5);
        }
      }
      pDVar1 = pParse->db->aDb;
      iVar3 = (int)uVar6;
      local_60.zDb = pDVar1[iVar3].zName;
      local_60.pSchema = pDVar1[iVar3].pSchema;
      local_60.zType = "view";
      local_60.pName = local_80;
      local_60.bVarOnly = (int)(iVar3 == 1);
      local_60.pParse = pParse;
      iVar3 = sqlite3FixSelect(&local_60,pSelect);
      if (iVar3 == 0) {
        pSVar7 = sqlite3SelectDup(db,pSelect,1);
        pTable->pSelect = pSVar7;
        clearSelect(db,pSelect,1);
        if (db->mallocFailed == '\0') {
          if ((db->init).busy == '\0') {
            sqlite3ViewGetColumnNames(pParse,pTable);
          }
          pcVar8 = (pParse->sLastToken).z;
          uVar6 = *(ulong *)&(pParse->sLastToken).n;
          if ((*pcVar8 != '\0') && (*pcVar8 != ';')) {
            pcVar8 = pcVar8 + (uVar6 & 0xffffffff);
          }
          local_78.z = pBegin->z;
          uVar4 = (int)pcVar8 - (int)local_78.z;
          if (0 < (int)uVar4) {
            do {
              if ((""[(byte)local_78.z[(ulong)uVar4 - 1]] & 1) == 0) goto LAB_00142855;
              bVar2 = 1 < (int)uVar4;
              uVar4 = uVar4 - 1;
            } while (bVar2);
            uVar4 = 0;
          }
LAB_00142855:
          local_78.z = local_78.z + (long)(int)uVar4 + -1;
          local_78._12_4_ = SUB84(uVar6 >> 0x20,0);
          local_78.n = 1;
          sqlite3EndTable(pParse,(Token *)0x0,&local_78,'\0',(Select *)0x0);
        }
        return;
      }
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"parameters are not allowed in views");
  }
  clearSelect(db,pSelect,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  sqlite3FixInit(&sFix, pParse, iDb, "view", pName);
  if( sqlite3FixSelect(&sFix, pSelect) ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  p->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  sqlite3SelectDelete(db, pSelect);
  if( db->mallocFailed ){
    return;
  }
  if( !db->init.busy ){
    sqlite3ViewGetColumnNames(pParse, p);
  }

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  if( ALWAYS(sEnd.z[0]!=0) && sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  z = pBegin->z;
  while( ALWAYS(n>0) && sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the SQLITE_MASTER table */
  sqlite3EndTable(pParse, 0, &sEnd, 0, 0);
  return;
}